

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void duckdb::SerializeVersionNumber(WriteStream *ser,string *version_str)

{
  ulong __n;
  data_t version [32];
  
  version[0x10] = '\0';
  version[0x11] = '\0';
  version[0x12] = '\0';
  version[0x13] = '\0';
  version[0x14] = '\0';
  version[0x15] = '\0';
  version[0x16] = '\0';
  version[0x17] = '\0';
  version[0x18] = '\0';
  version[0x19] = '\0';
  version[0x1a] = '\0';
  version[0x1b] = '\0';
  version[0x1c] = '\0';
  version[0x1d] = '\0';
  version[0x1e] = '\0';
  version[0x1f] = '\0';
  version[0] = '\0';
  version[1] = '\0';
  version[2] = '\0';
  version[3] = '\0';
  version[4] = '\0';
  version[5] = '\0';
  version[6] = '\0';
  version[7] = '\0';
  version[8] = '\0';
  version[9] = '\0';
  version[10] = '\0';
  version[0xb] = '\0';
  version[0xc] = '\0';
  version[0xd] = '\0';
  version[0xe] = '\0';
  version[0xf] = '\0';
  __n = version_str->_M_string_length;
  if (0x1f < version_str->_M_string_length) {
    __n = 0x20;
  }
  switchD_016b45db::default(version,(version_str->_M_dataplus)._M_p,__n);
  (**ser->_vptr_WriteStream)(ser,version,0x20);
  return;
}

Assistant:

void SerializeVersionNumber(WriteStream &ser, const string &version_str) {
	data_t version[MainHeader::MAX_VERSION_SIZE];
	memset(version, 0, MainHeader::MAX_VERSION_SIZE);
	memcpy(version, version_str.c_str(), MinValue<idx_t>(version_str.size(), MainHeader::MAX_VERSION_SIZE));
	ser.WriteData(version, MainHeader::MAX_VERSION_SIZE);
}